

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O3

void g_hash_table_foreach(GHashTable *hash_table,GHFunc func,gpointer user_data)

{
  GHashNode *pGVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((func != (GHFunc)0x0 && hash_table != (GHashTable *)0x0) &&
     (iVar2 = hash_table->size, 0 < iVar2)) {
    lVar3 = 0x10;
    lVar4 = 0;
    do {
      pGVar1 = hash_table->nodes;
      if (1 < *(uint *)((long)&pGVar1->key + lVar3)) {
        (*func)(*(gpointer *)((long)pGVar1 + lVar3 + -0x10),*(gpointer *)((long)pGVar1 + lVar3 + -8)
                ,user_data);
        iVar2 = hash_table->size;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void g_hash_table_foreach (GHashTable *hash_table,
        GHFunc      func,
        gpointer    user_data)
{
    gint i;

    if (hash_table == NULL) return;
    if (func == NULL) return;

    for (i = 0; i < hash_table->size; i++)
    {
        GHashNode *node = &hash_table->nodes [i];

        if (node->key_hash > 1)
            (* func) (node->key, node->value, user_data);
    }
}